

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BindInactiveAliasingAttributeTest::BindInactiveAliasingAttributeTest
          (BindInactiveAliasingAttributeTest *this,TestContext *testCtx,RenderContext *renderCtx,
          AttribType *type,int arraySize)

{
  int arraySize_00;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  AttribType *pAVar1;
  
  pAVar1 = type;
  gls::(anonymous_namespace)::generateTestName_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)type,(AttribType *)(ulong)(uint)arraySize,(int)type)
  ;
  arraySize_00 = (int)pAVar1;
  std::operator+(&local_70,"max_inactive_",&local_50);
  gls::(anonymous_namespace)::generateTestName_abi_cxx11_
            (&local_b0,(_anonymous_namespace_ *)type,(AttribType *)(ulong)(uint)arraySize,
             arraySize_00);
  std::operator+(&local_90,"max_inactive_",&local_b0);
  tcu::TestCase::TestCase
            (&this->super_TestCase,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BindInactiveAliasingAttributeTest_01e6fb38;
  this->m_renderCtx = renderCtx;
  AttributeLocationTestUtil::AttribType::AttribType(&this->m_type,type);
  this->m_arraySize = arraySize;
  return;
}

Assistant:

BindInactiveAliasingAttributeTest::BindInactiveAliasingAttributeTest (tcu::TestContext&		testCtx,
																	  glu::RenderContext&	renderCtx,
																	  const AttribType&		type,
																	  int					arraySize)
	: TestCase		(testCtx,	("max_inactive_" + generateTestName(type, arraySize)).c_str(),
								("max_inactive_" + generateTestName(type, arraySize)).c_str())
	, m_renderCtx	(renderCtx)
	, m_type		(type)
	, m_arraySize	(arraySize)
{
}